

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

bool __thiscall
cmsys::SystemInformationImplementation::DoesCPUSupportFeature
          (SystemInformationImplementation *this,long dwFeature)

{
  bool local_19;
  bool bHasFeature;
  long dwFeature_local;
  SystemInformationImplementation *this_local;
  
  local_19 = false;
  if (((dwFeature & 1U) != 0) && (((this->Features).HasMMX & 1U) != 0)) {
    local_19 = true;
  }
  if (((dwFeature & 2U) != 0) && (((this->Features).ExtendedFeatures.HasMMXPlus & 1U) != 0)) {
    local_19 = true;
  }
  if (((dwFeature & 4U) != 0) && (((this->Features).HasSSE & 1U) != 0)) {
    local_19 = true;
  }
  if (((dwFeature & 0x800U) != 0) && (((this->Features).HasSSEFP & 1U) != 0)) {
    local_19 = true;
  }
  if (((dwFeature & 0x1000U) != 0) && (((this->Features).ExtendedFeatures.HasSSEMMX & 1U) != 0)) {
    local_19 = true;
  }
  if (((dwFeature & 8U) != 0) && (((this->Features).HasSSE2 & 1U) != 0)) {
    local_19 = true;
  }
  if (((dwFeature & 0x10U) != 0) && (((this->Features).ExtendedFeatures.Has3DNow & 1U) != 0)) {
    local_19 = true;
  }
  if (((dwFeature & 0x20U) != 0) && (((this->Features).ExtendedFeatures.Has3DNowPlus & 1U) != 0)) {
    local_19 = true;
  }
  if (((dwFeature & 0x40U) != 0) && (((this->Features).HasIA64 & 1U) != 0)) {
    local_19 = true;
  }
  if (((dwFeature & 0x80U) != 0) && (((this->Features).ExtendedFeatures.SupportsMP & 1U) != 0)) {
    local_19 = true;
  }
  if (((dwFeature & 0x200U) != 0) && (((this->Features).HasSerial & 1U) != 0)) {
    local_19 = true;
  }
  if (((dwFeature & 0x400U) != 0) && (((this->Features).HasAPIC & 1U) != 0)) {
    local_19 = true;
  }
  if (((dwFeature & 0x2000U) != 0) && (((this->Features).HasCMOV & 1U) != 0)) {
    local_19 = true;
  }
  if (((dwFeature & 0x4000U) != 0) && (((this->Features).HasMTRR & 1U) != 0)) {
    local_19 = true;
  }
  if (((dwFeature & 0x8000U) != 0) && ((this->Features).L1CacheSize != -1)) {
    local_19 = true;
  }
  if (((dwFeature & 0x10000U) != 0) && ((this->Features).L2CacheSize != -1)) {
    local_19 = true;
  }
  if (((dwFeature & 0x20000U) != 0) && ((this->Features).L3CacheSize != -1)) {
    local_19 = true;
  }
  if (((dwFeature & 0x40000U) != 0) && (((this->Features).HasACPI & 1U) != 0)) {
    local_19 = true;
  }
  if (((dwFeature & 0x80000U) != 0) && (((this->Features).HasThermal & 1U) != 0)) {
    local_19 = true;
  }
  if (((dwFeature & 0x100000U) != 0) &&
     (((this->Features).ExtendedFeatures.PowerManagement.HasTempSenseDiode & 1U) != 0)) {
    local_19 = true;
  }
  if (((dwFeature & 0x200000U) != 0) &&
     (((this->Features).ExtendedFeatures.PowerManagement.HasFrequencyID & 1U) != 0)) {
    local_19 = true;
  }
  if (((dwFeature & 0x400000U) != 0) &&
     (((this->Features).ExtendedFeatures.PowerManagement.HasVoltageID & 1U) != 0)) {
    local_19 = true;
  }
  return local_19;
}

Assistant:

bool SystemInformationImplementation::DoesCPUSupportFeature(long int dwFeature)
{
  bool bHasFeature = false;

  // Check for MMX instructions.
  if (((dwFeature & MMX_FEATURE) != 0) && this->Features.HasMMX) bHasFeature = true;

  // Check for MMX+ instructions.
  if (((dwFeature & MMX_PLUS_FEATURE) != 0) && this->Features.ExtendedFeatures.HasMMXPlus) bHasFeature = true;

  // Check for SSE FP instructions.
  if (((dwFeature & SSE_FEATURE) != 0) && this->Features.HasSSE) bHasFeature = true;

  // Check for SSE FP instructions.
  if (((dwFeature & SSE_FP_FEATURE) != 0) && this->Features.HasSSEFP) bHasFeature = true;

  // Check for SSE MMX instructions.
  if (((dwFeature & SSE_MMX_FEATURE) != 0) && this->Features.ExtendedFeatures.HasSSEMMX) bHasFeature = true;

  // Check for SSE2 instructions.
  if (((dwFeature & SSE2_FEATURE) != 0) && this->Features.HasSSE2) bHasFeature = true;

  // Check for 3DNow! instructions.
  if (((dwFeature & AMD_3DNOW_FEATURE) != 0) && this->Features.ExtendedFeatures.Has3DNow) bHasFeature = true;

  // Check for 3DNow+ instructions.
  if (((dwFeature & AMD_3DNOW_PLUS_FEATURE) != 0) && this->Features.ExtendedFeatures.Has3DNowPlus) bHasFeature = true;

  // Check for IA64 instructions.
  if (((dwFeature & IA64_FEATURE) != 0) && this->Features.HasIA64) bHasFeature = true;

  // Check for MP capable.
  if (((dwFeature & MP_CAPABLE) != 0) && this->Features.ExtendedFeatures.SupportsMP) bHasFeature = true;

  // Check for a serial number for the processor.
  if (((dwFeature & SERIALNUMBER_FEATURE) != 0) && this->Features.HasSerial) bHasFeature = true;

  // Check for a local APIC in the processor.
  if (((dwFeature & APIC_FEATURE) != 0) && this->Features.HasAPIC) bHasFeature = true;

  // Check for CMOV instructions.
  if (((dwFeature & CMOV_FEATURE) != 0) && this->Features.HasCMOV) bHasFeature = true;

  // Check for MTRR instructions.
  if (((dwFeature & MTRR_FEATURE) != 0) && this->Features.HasMTRR) bHasFeature = true;

  // Check for L1 cache size.
  if (((dwFeature & L1CACHE_FEATURE) != 0) && (this->Features.L1CacheSize != -1)) bHasFeature = true;

  // Check for L2 cache size.
  if (((dwFeature & L2CACHE_FEATURE) != 0) && (this->Features.L2CacheSize != -1)) bHasFeature = true;

  // Check for L3 cache size.
  if (((dwFeature & L3CACHE_FEATURE) != 0) && (this->Features.L3CacheSize != -1)) bHasFeature = true;

  // Check for ACPI capability.
  if (((dwFeature & ACPI_FEATURE) != 0) && this->Features.HasACPI) bHasFeature = true;

  // Check for thermal monitor support.
  if (((dwFeature & THERMALMONITOR_FEATURE) != 0) && this->Features.HasThermal) bHasFeature = true;

  // Check for temperature sensing diode support.
  if (((dwFeature & TEMPSENSEDIODE_FEATURE) != 0) && this->Features.ExtendedFeatures.PowerManagement.HasTempSenseDiode) bHasFeature = true;

  // Check for frequency ID support.
  if (((dwFeature & FREQUENCYID_FEATURE) != 0) && this->Features.ExtendedFeatures.PowerManagement.HasFrequencyID) bHasFeature = true;

  // Check for voltage ID support.
  if (((dwFeature & VOLTAGEID_FREQUENCY) != 0) && this->Features.ExtendedFeatures.PowerManagement.HasVoltageID) bHasFeature = true;

  return bHasFeature;
}